

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartDTDAttlist(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  void *pvVar4;
  undefined8 *data;
  xmlChar *pxVar5;
  int iVar6;
  
  iVar6 = -1;
  if (((name != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) && (*name != '\0')) &&
     (lk = xmlListFront(writer->nodes), lk != (xmlLinkPtr)0x0)) {
    pvVar4 = xmlLinkGetData(lk);
    iVar1 = 0;
    if (((pvVar4 != (void *)0x0) && (iVar2 = *(int *)((long)pvVar4 + 8), iVar1 = 0, iVar2 != 0)) &&
       (iVar2 != 8)) {
      if (iVar2 != 7) {
        return -1;
      }
      iVar1 = xmlOutputBufferWriteString(writer->out," [");
      if (iVar1 < 0) {
        return -1;
      }
      if (writer->indent != 0) {
        iVar2 = xmlOutputBufferWriteString(writer->out,"\n");
        if (iVar2 < 0) {
          return -1;
        }
        iVar1 = iVar1 + iVar2;
      }
      *(undefined4 *)((long)pvVar4 + 8) = 8;
    }
    data = (undefined8 *)(*xmlMalloc)(0x10);
    if (data == (undefined8 *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDAttlist : out of memory!\n");
    }
    else {
      pxVar5 = xmlStrdup(name);
      *data = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDAttlist : out of memory!\n");
        (*xmlFree)(data);
      }
      else {
        *(undefined4 *)(data + 1) = 0xb;
        xmlListPushFront(writer->nodes,data);
        if (writer->indent != 0) {
          iVar2 = xmlTextWriterWriteIndent(writer);
          if (iVar2 < 0) {
            return -1;
          }
          iVar1 = iVar1 + iVar2;
        }
        iVar2 = xmlOutputBufferWriteString(writer->out,"<!ATTLIST ");
        if ((-1 < iVar2) &&
           (iVar3 = xmlOutputBufferWriteString(writer->out,(char *)name), -1 < iVar3)) {
          iVar6 = iVar2 + iVar1 + iVar3;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int
xmlTextWriterStartDTDAttlist(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p != 0) {
        switch (p->state) {
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, " [");
                if (count < 0)
                    return -1;
                sum += count;
                if (writer->indent) {
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                    if (count < 0)
                        return -1;
                    sum += count;
                }
                p->state = XML_TEXTWRITER_DTD_TEXT;
                /* fallthrough */
            case XML_TEXTWRITER_DTD_TEXT:
            case XML_TEXTWRITER_NONE:
                break;
            default:
                return -1;
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDAttlist : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDAttlist : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_DTD_ATTL;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!ATTLIST ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}